

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O0

int Abc_CommandGraft(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Wlc_Ntk_t *pWVar2;
  char *pcVar3;
  uint local_38;
  int fVerbose;
  int c;
  Wlc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pWVar2 = Wlc_AbcGetNtk(pAbc);
  local_38 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar1 == -1) {
      if (pWVar2 == (Wlc_Ntk_t *)0x0) {
        Abc_Print(1,"Abc_CommandGraft(): There is no current design.\n");
      }
      else {
        pWVar2 = Wlc_NtkGraftMulti(pWVar2,local_38);
        Wlc_AbcUpdateNtk(pAbc,pWVar2);
      }
      return 0;
    }
    if ((iVar1 == 0x68) || (iVar1 != 0x76)) break;
    local_38 = local_38 ^ 1;
  }
  Abc_Print(-2,"usage: %%graft [-vh]\n");
  Abc_Print(-2,"\t         detects multipliers in LHS of the miter and moves them to RHS\n");
  pcVar3 = "no";
  if (local_38 != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandGraft( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Wlc_Ntk_t * Wlc_NtkGraftMulti( Wlc_Ntk_t * p, int fVerbose );
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    int c, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandGraft(): There is no current design.\n" );
        return 0;
    }
    pNtk = Wlc_NtkGraftMulti( pNtk, fVerbose );
    Wlc_AbcUpdateNtk( pAbc, pNtk );
    return 0;
usage:
    Abc_Print( -2, "usage: %%graft [-vh]\n" );
    Abc_Print( -2, "\t         detects multipliers in LHS of the miter and moves them to RHS\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}